

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

void __thiscall UnifiedRegex::Matcher::PopStats(Matcher *this,ContStack *contStack,Char *input)

{
  uint64 *puVar1;
  char *pcVar2;
  
  if (this->stats != (Type)0x0) {
    puVar1 = &this->stats->numPops;
    *puVar1 = *puVar1 + 1;
  }
  if (this->w != (Type)0x0) {
    pcVar2 = ContinuousPageStack<1UL>::Top
                       ((ContinuousPageStack<1UL> *)contStack,
                        (contStack->
                        super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                        topElementSize);
    if (pcVar2 != (char *)0x0) {
      DebugWriter::Print(this->w,L"POP ");
      (*(code *)**(undefined8 **)(pcVar2 + 8))(pcVar2 + 8,this->w,input);
      return;
    }
    DebugWriter::PrintEOL(this->w,L"<empty stack>");
    return;
  }
  return;
}

Assistant:

void Matcher::PopStats(ContStack& contStack, const Char* const input) const
    {
        if (stats != 0)
        {
            stats->numPops++;
        }
        if (w != 0)
        {
            const Cont* top = contStack.Top();
            if (top == 0)
                w->PrintEOL(_u("<empty stack>"));
            else
            {
                w->Print(_u("POP "));
                top->Print(w, input);
            }
        }
    }